

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1508.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  CURLcode ec;
  CURLM *m;
  int res;
  char *URL_local;
  
  m._4_4_ = 0;
  iVar1 = curl_global_init(3);
  if (iVar1 != 0) {
    uVar4 = _stderr;
    iVar5 = iVar1;
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar4,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1508.c"
                  ,0x23,iVar5,uVar2,uVar4,iVar5,0);
    m._4_4_ = iVar1;
  }
  if (m._4_4_ == 0) {
    lVar3 = curl_multi_init();
    if (lVar3 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib1508.c"
                    ,0x25);
      m._4_4_ = 0x7b;
    }
    curl_multi_cleanup(lVar3);
    curl_global_cleanup();
    curl_mprintf("We are done\n");
    URL_local._4_4_ = m._4_4_;
  }
  else {
    URL_local._4_4_ = m._4_4_;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURLM *m = NULL;

  (void)URL;

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

test_cleanup:

  /* proper cleanup sequence - type PB */

  curl_multi_cleanup(m);
  curl_global_cleanup();

  printf("We are done\n");

  return res;
}